

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmake_query.cpp
# Opt level: O1

int __thiscall
cmakels::cmake_query::cmake_query::configure(cmake_query *this,path *cmake_query_build_dir)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  cmake *this_00;
  pointer pcVar2;
  char cVar3;
  int iVar4;
  ostream *poVar5;
  path cmake_cache_src;
  path dst;
  ifstream in;
  ofstream out;
  string local_4b8;
  path local_498;
  string local_470;
  path local_450;
  path local_428 [13];
  undefined1 local_220 [16];
  _func_int *local_210 [29];
  ios_base local_128 [264];
  
  std::filesystem::__cxx11::path::path<char[15],std::filesystem::__cxx11::path>
            (local_428,(char (*) [15])0x536fbf,auto_format);
  std::filesystem::__cxx11::operator/(&local_498,&this->build_dir_,local_428);
  std::filesystem::__cxx11::path::~path(local_428);
  std::filesystem::create_directories(cmake_query_build_dir);
  cVar3 = std::filesystem::status(&local_498);
  if ((cVar3 == '\0') || (cVar3 == -1)) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"No CMakeCache.txt was found at ",0x1f);
    paVar1 = &local_428[0]._M_pathname.field_2;
    local_428[0]._M_pathname._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_428,local_498._M_pathname._M_dataplus._M_p,
               local_498._M_pathname._M_dataplus._M_p + local_498._M_pathname._M_string_length);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cerr,local_428[0]._M_pathname._M_dataplus._M_p,
                        local_428[0]._M_pathname._M_string_length);
    std::ios::widen((char)poVar5->_vptr_basic_ostream[-3] + (char)poVar5);
    std::ostream::put((char)poVar5);
    std::ostream::flush();
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_428[0]._M_pathname._M_dataplus._M_p != paVar1) {
      operator_delete(local_428[0]._M_pathname._M_dataplus._M_p,
                      local_428[0]._M_pathname.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    std::filesystem::__cxx11::path::path<char[15],std::filesystem::__cxx11::path>
              (local_428,(char (*) [15])0x536fbf,auto_format);
    std::filesystem::__cxx11::operator/(&local_450,cmake_query_build_dir,local_428);
    std::filesystem::__cxx11::path::~path(local_428);
    local_220._0_8_ = local_210;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_220,local_498._M_pathname._M_dataplus._M_p,
               local_498._M_pathname._M_dataplus._M_p + local_498._M_pathname._M_string_length);
    std::ifstream::ifstream(local_428,(string *)local_220,_S_in);
    if ((_func_int **)local_220._0_8_ != local_210) {
      operator_delete((void *)local_220._0_8_,(ulong)(local_210[0] + 1));
    }
    paVar1 = &local_4b8.field_2;
    local_4b8._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_4b8,local_450._M_pathname._M_dataplus._M_p,
               local_450._M_pathname._M_dataplus._M_p + local_450._M_pathname._M_string_length);
    std::ofstream::ofstream(local_220,(string *)&local_4b8,_S_out);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_4b8._M_dataplus._M_p != paVar1) {
      operator_delete(local_4b8._M_dataplus._M_p,local_4b8.field_2._M_allocated_capacity + 1);
    }
    local_4b8._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_4b8,local_498._M_pathname._M_dataplus._M_p,
               local_498._M_pathname._M_dataplus._M_p + local_498._M_pathname._M_string_length);
    local_470._M_dataplus._M_p = (pointer)&local_470.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_470,local_450._M_pathname._M_dataplus._M_p,
               local_450._M_pathname._M_dataplus._M_p + local_450._M_pathname._M_string_length);
    support::stream_replace_all((istream *)local_428,(ostream *)local_220,&local_4b8,&local_470);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_470._M_dataplus._M_p != &local_470.field_2) {
      operator_delete(local_470._M_dataplus._M_p,local_470.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_4b8._M_dataplus._M_p != paVar1) {
      operator_delete(local_4b8._M_dataplus._M_p,local_4b8.field_2._M_allocated_capacity + 1);
    }
    local_220._0_8_ = _VTT;
    *(undefined8 *)(local_220 + (long)_VTT[-3]) = _SSL_CTX_load_verify_locations;
    std::filebuf::~filebuf((filebuf *)(local_220 + 8));
    std::ios_base::~ios_base(local_128);
    std::ifstream::~ifstream(local_428);
    std::filesystem::__cxx11::path::~path(&local_450);
  }
  this_00 = (this->my_cmake)._M_t.super___uniq_ptr_impl<cmake,_std::default_delete<cmake>_>._M_t.
            super__Tuple_impl<0UL,_cmake_*,_std::default_delete<cmake>_>.
            super__Head_base<0UL,_cmake_*,_false>._M_head_impl;
  pcVar2 = (cmake_query_build_dir->_M_pathname)._M_dataplus._M_p;
  paVar1 = &local_428[0]._M_pathname.field_2;
  local_428[0]._M_pathname._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_428,pcVar2,
             pcVar2 + (cmake_query_build_dir->_M_pathname)._M_string_length);
  cmake::SetHomeOutputDirectory(this_00,&local_428[0]._M_pathname);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_428[0]._M_pathname._M_dataplus._M_p != paVar1) {
    operator_delete(local_428[0]._M_pathname._M_dataplus._M_p,
                    local_428[0]._M_pathname.field_2._M_allocated_capacity + 1);
  }
  local_428[0]._M_pathname._M_dataplus._M_p = (pointer)0x0;
  local_428[0]._M_pathname._M_string_length = 0;
  local_428[0]._M_pathname.field_2._M_allocated_capacity = 0;
  iVar4 = cmake::Run((this->my_cmake)._M_t.super___uniq_ptr_impl<cmake,_std::default_delete<cmake>_>
                     ._M_t.super__Tuple_impl<0UL,_cmake_*,_std::default_delete<cmake>_>.
                     super__Head_base<0UL,_cmake_*,_false>._M_head_impl,
                     (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_428,false,true);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_428);
  std::filesystem::__cxx11::path::~path(&local_498);
  return iVar4;
}

Assistant:

int cmake_query::configure(fs::path const &cmake_query_build_dir) {
  fs::path cmake_cache_src{build_dir_ / "CMakeCache.txt"};
  fs::create_directories(cmake_query_build_dir);
  if (fs::exists(cmake_cache_src)) {
    auto dst = cmake_query_build_dir / "CMakeCache.txt";
    copy_cmake_cache(cmake_cache_src, dst);
  } else {
    std::cerr << "No CMakeCache.txt was found at " << cmake_cache_src.string()
              << std::endl;
  }
  my_cmake->SetHomeOutputDirectory(cmake_query_build_dir.string());

  return my_cmake->Run(std::vector<std::string>{}, false, true);
}